

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Integrate::ChFunction_Integrate
          (ChFunction_Integrate *this,ChFunction_Integrate *other)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Integrate_01190868;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  iVar2 = (*((other->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var,iVar2));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  this->order = other->order;
  dVar1 = other->x_start;
  this->C_start = other->C_start;
  this->x_start = dVar1;
  this->x_end = other->x_end;
  this->num_samples = other->num_samples;
  Eigen::internal::
  call_assignment<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>>
            (&this->array_x,&other->array_x);
  return;
}

Assistant:

ChFunction_Integrate::ChFunction_Integrate(const ChFunction_Integrate& other) {
    fa = std::shared_ptr<ChFunction>(other.fa->Clone());
    order = other.order;
    C_start = other.C_start;
    x_start = other.x_start;
    x_end = other.x_end;
    num_samples = other.num_samples;
    array_x = other.array_x;
}